

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::process_and_close_socket<std::function<bool(httplib::Stream&,bool,bool&)>>
               (bool is_client_request,socket_t sock,size_t keep_alive_max_count,
               time_t read_timeout_sec,time_t read_timeout_usec,
               function<bool_(httplib::Stream_&,_bool,_bool_&)> *callback)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  bool local_99;
  undefined1 local_98 [7];
  bool dummy_connection_close;
  SocketStream strm_1;
  bool local_62;
  undefined1 local_61;
  undefined1 local_60 [6];
  bool connection_close;
  bool last_connection;
  SocketStream strm;
  size_t count;
  bool ret;
  function<bool_(httplib::Stream_&,_bool,_bool_&)> *callback_local;
  time_t read_timeout_usec_local;
  time_t read_timeout_sec_local;
  size_t keep_alive_max_count_local;
  socket_t sock_local;
  bool is_client_request_local;
  
  if (keep_alive_max_count == 0) {
    __assert_fail("keep_alive_max_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/build_O0/external/httplib/src/httplib/httplib.h"
                  ,0x4aa,
                  "bool httplib::detail::process_and_close_socket(bool, socket_t, size_t, time_t, time_t, T) [T = std::function<bool (httplib::Stream &, bool, bool &)>]"
                 );
  }
  count._7_1_ = false;
  sVar2 = keep_alive_max_count;
  if (keep_alive_max_count < 2) {
    SocketStream::SocketStream((SocketStream *)local_98,sock,read_timeout_sec,read_timeout_usec);
    local_99 = false;
    count._7_1_ = std::function<bool_(httplib::Stream_&,_bool,_bool_&)>::operator()
                            (callback,(Stream *)local_98,true,&local_99);
    SocketStream::~SocketStream((SocketStream *)local_98);
  }
  else {
    do {
      strm.read_timeout_usec_ = sVar2;
      bVar1 = false;
      if ((strm.read_timeout_usec_ != 0) && (bVar1 = true, !is_client_request)) {
        iVar3 = select_read(sock,5,0);
        bVar1 = 0 < iVar3;
      }
      if (!bVar1) break;
      SocketStream::SocketStream((SocketStream *)local_60,sock,read_timeout_sec,read_timeout_usec);
      local_61 = strm.read_timeout_usec_ == 1;
      local_62 = false;
      count._7_1_ = std::function<bool_(httplib::Stream_&,_bool,_bool_&)>::operator()
                              (callback,(Stream *)local_60,(bool)local_61,&local_62);
      if ((count._7_1_) && ((local_62 & 1U) == 0)) {
        strm.read_timeout_usec_ = strm.read_timeout_usec_ + -1;
        strm_1.read_timeout_usec_._0_4_ = 0;
      }
      else {
        strm_1.read_timeout_usec_._0_4_ = 3;
      }
      SocketStream::~SocketStream((SocketStream *)local_60);
      sVar2 = strm.read_timeout_usec_;
    } while ((int)strm_1.read_timeout_usec_ == 0);
  }
  close_socket(sock);
  return count._7_1_;
}

Assistant:

inline bool process_and_close_socket(bool is_client_request, socket_t sock,
                                     size_t keep_alive_max_count,
                                     time_t read_timeout_sec,
                                     time_t read_timeout_usec, T callback) {
  assert(keep_alive_max_count > 0);

  bool ret = false;

  if (keep_alive_max_count > 1) {
    auto count = keep_alive_max_count;
    while (count > 0 &&
           (is_client_request ||
            detail::select_read(sock, CPPHTTPLIB_KEEPALIVE_TIMEOUT_SECOND,
                                CPPHTTPLIB_KEEPALIVE_TIMEOUT_USECOND) > 0)) {
      SocketStream strm(sock, read_timeout_sec, read_timeout_usec);
      auto last_connection = count == 1;
      auto connection_close = false;

      ret = callback(strm, last_connection, connection_close);
      if (!ret || connection_close) { break; }

      count--;
    }
  } else {
    SocketStream strm(sock, read_timeout_sec, read_timeout_usec);
    auto dummy_connection_close = false;
    ret = callback(strm, true, dummy_connection_close);
  }

  close_socket(sock);
  return ret;
}